

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fiorso(voccxdef *vctx,char *fname)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  size_t sVar13;
  long lVar14;
  char *in_RSI;
  long in_RDI;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  byte bVar28;
  int typ;
  int flags;
  char wrd [80];
  int len2;
  int len1;
  objnum sc;
  int sccnt;
  ulong skip_len;
  int result;
  int version;
  char timestamp [26];
  int err;
  ushort newsiz;
  uchar buf [21];
  mcmcxdef *mctx;
  int propcnt;
  uint oldmutsiz;
  uint mutsiz;
  uchar *mut;
  uchar *p;
  objnum obj;
  osfildef *fp;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined2 in_stack_fffffffffffffec4;
  mcmon in_stack_fffffffffffffec6;
  undefined6 in_stack_fffffffffffffec8;
  objnum in_stack_fffffffffffffece;
  mcmcxdef *in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffedc;
  voccxdef *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  objnum in_stack_fffffffffffffeec;
  objnum in_stack_fffffffffffffeee;
  int in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef4;
  ushort uVar29;
  mcmon in_stack_fffffffffffffef6;
  undefined2 uVar30;
  int in_stack_fffffffffffffef8;
  objnum in_stack_fffffffffffffefc;
  prpnum in_stack_fffffffffffffefe;
  undefined6 in_stack_ffffffffffffff00;
  ushort in_stack_ffffffffffffff06;
  mcmcxdef *in_stack_ffffffffffffff08;
  uchar *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  objnum in_stack_ffffffffffffff1e;
  mcmcxdef *in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff54;
  long in_stack_ffffffffffffff58;
  int iVar31;
  undefined1 local_98 [6];
  objnum in_stack_ffffffffffffff6e;
  voccxdef *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff80;
  byte local_68;
  byte bStack_67;
  char cStack_66;
  char cStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  char cStack_59;
  undefined1 auStack_58 [8];
  undefined8 *local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  void *local_38;
  mcmcxdef *local_30;
  ushort local_22;
  FILE *local_20;
  long local_10;
  
  local_50 = *(undefined8 **)(in_RDI + 0x18);
  bVar7 = false;
  local_10 = in_RDI;
  local_20 = fopen(in_RSI,"rb");
  if (local_20 == (FILE *)0x0) {
    return 1;
  }
  sVar13 = fread(&local_68,0x12,1,local_20);
  if (sVar13 == 1) {
    cVar15 = -(cStack_66 == 'D');
    cVar16 = -(cStack_65 == 'S');
    cVar17 = -(cStack_64 == '2');
    cVar18 = -(cStack_63 == ' ');
    cVar19 = -(cStack_62 == 's');
    cVar20 = -(cStack_61 == 'a');
    cVar21 = -(cStack_60 == 'v');
    cVar22 = -(cStack_5f == 'e');
    cVar23 = -(cStack_5e == '/');
    cVar24 = -(cStack_5d == 'g');
    cVar25 = -(cStack_5c == '\n');
    cVar26 = -(cStack_5b == '\r');
    cVar27 = -(cStack_5a == '\x1a');
    bVar28 = -(cStack_59 == '\0');
    auVar1[1] = -(bStack_67 == 0x41);
    auVar1[0] = -(local_68 == 0x54);
    auVar1[2] = cVar15;
    auVar1[3] = cVar16;
    auVar1[4] = cVar17;
    auVar1[5] = cVar18;
    auVar1[6] = cVar19;
    auVar1[7] = cVar20;
    auVar1[8] = cVar21;
    auVar1[9] = cVar22;
    auVar1[10] = cVar23;
    auVar1[0xb] = cVar24;
    auVar1[0xc] = cVar25;
    auVar1[0xd] = cVar26;
    auVar1[0xe] = cVar27;
    auVar1[0xf] = bVar28;
    auVar2[1] = -(bStack_67 == 0x41);
    auVar2[0] = -(local_68 == 0x54);
    auVar2[2] = cVar15;
    auVar2[3] = cVar16;
    auVar2[4] = cVar17;
    auVar2[5] = cVar18;
    auVar2[6] = cVar19;
    auVar2[7] = cVar20;
    auVar2[8] = cVar21;
    auVar2[9] = cVar22;
    auVar2[10] = cVar23;
    auVar2[0xb] = cVar24;
    auVar2[0xc] = cVar25;
    auVar2[0xd] = cVar26;
    auVar2[0xe] = cVar27;
    auVar2[0xf] = bVar28;
    auVar6[1] = cVar16;
    auVar6[0] = cVar15;
    auVar6[2] = cVar17;
    auVar6[3] = cVar18;
    auVar6[4] = cVar19;
    auVar6[5] = cVar20;
    auVar6[6] = cVar21;
    auVar6[7] = cVar22;
    auVar6[8] = cVar23;
    auVar6[9] = cVar24;
    auVar6[10] = cVar25;
    auVar6[0xb] = cVar26;
    auVar6[0xc] = cVar27;
    auVar6[0xd] = bVar28;
    auVar5[1] = cVar17;
    auVar5[0] = cVar16;
    auVar5[2] = cVar18;
    auVar5[3] = cVar19;
    auVar5[4] = cVar20;
    auVar5[5] = cVar21;
    auVar5[6] = cVar22;
    auVar5[7] = cVar23;
    auVar5[8] = cVar24;
    auVar5[9] = cVar25;
    auVar5[10] = cVar26;
    auVar5[0xb] = cVar27;
    auVar5[0xc] = bVar28;
    auVar4[1] = cVar18;
    auVar4[0] = cVar17;
    auVar4[2] = cVar19;
    auVar4[3] = cVar20;
    auVar4[4] = cVar21;
    auVar4[5] = cVar22;
    auVar4[6] = cVar23;
    auVar4[7] = cVar24;
    auVar4[8] = cVar25;
    auVar4[9] = cVar26;
    auVar4[10] = cVar27;
    auVar4[0xb] = bVar28;
    auVar3[1] = cVar19;
    auVar3[0] = cVar18;
    auVar3[2] = cVar20;
    auVar3[3] = cVar21;
    auVar3[4] = cVar22;
    auVar3[5] = cVar23;
    auVar3[6] = cVar24;
    auVar3[7] = cVar25;
    auVar3[8] = cVar26;
    auVar3[9] = cVar27;
    auVar3[10] = bVar28;
    if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3
                 | (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar28,CONCAT18(cVar27,CONCAT17(cVar26,CONCAT16(cVar25,
                                                  CONCAT15(cVar24,CONCAT14(cVar23,CONCAT13(cVar22,
                                                  CONCAT12(cVar21,CONCAT11(cVar20,cVar19))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar28,CONCAT17(cVar27,CONCAT16(cVar26,CONCAT15(cVar25,
                                                  CONCAT14(cVar24,CONCAT13(cVar23,CONCAT12(cVar22,
                                                  CONCAT11(cVar21,cVar20)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar28 >> 7) << 0xf) != 0xffff) goto LAB_00274be4;
    iVar8 = osrp2(auStack_58);
    in_stack_ffffffffffffff58 = (long)iVar8;
    fseek(local_20,in_stack_ffffffffffffff58,1);
  }
  else {
LAB_00274be4:
    fseek(local_20,0,0);
  }
  sVar13 = fread(&local_68,0x15,1,local_20);
  if ((sVar13 == 1) && (iVar8 = memcmp(&local_68,"TADS2 save\n\r\x1a",0xe), iVar8 == 0)) {
    iVar8 = memcmp(&cStack_5a,"v2.2.1",7);
    if (iVar8 == 0) {
      iVar31 = 0;
    }
    else {
      iVar8 = memcmp(&cStack_5a,"v2.2.0",7);
      if (iVar8 != 0) {
        iVar8 = 3;
        goto LAB_0027544e;
      }
      iVar31 = 1;
    }
    sVar13 = fread(local_98,0x1a,1,local_20);
    if ((sVar13 == 1) && (iVar8 = memcmp(local_98,(void *)(local_10 + 0xf24),0x1a), iVar8 == 0)) {
      vocrevert(in_stack_fffffffffffffee0);
      iVar8 = 5;
      while (sVar13 = fread(&local_68,7,1,local_20), sVar13 == 1) {
        iVar9 = osrp2(&bStack_67);
        local_22 = (ushort)iVar9;
        if (local_22 == 0xffff) {
          iVar9 = fiorfda((osfildef *)
                          CONCAT26(in_stack_fffffffffffffeee,
                                   CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)),
                          (vocddef *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
          if (((iVar9 == 0) &&
              (iVar9 = fiorfda((osfildef *)
                               CONCAT26(in_stack_fffffffffffffeee,
                                        CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8
                                                )),(vocddef *)in_stack_fffffffffffffee0,
                               in_stack_fffffffffffffedc), iVar9 == 0)) &&
             (iVar9 = fiorfda((osfildef *)
                              CONCAT26(in_stack_fffffffffffffeee,
                                       CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                                      ),(vocddef *)in_stack_fffffffffffffee0,
                              in_stack_fffffffffffffedc), iVar9 == 0)) goto LAB_002751f0;
          break;
        }
        if (local_68 == 1) {
          local_3c = osrp2(&cStack_65);
          local_30 = (mcmcxdef *)
                     mcmalo0(in_stack_ffffffffffffff08,in_stack_ffffffffffffff06,
                             (mcmon *)CONCAT26(in_stack_fffffffffffffefe,
                                               CONCAT24(in_stack_fffffffffffffefc,
                                                        in_stack_fffffffffffffef8)),
                             in_stack_fffffffffffffef6,in_stack_fffffffffffffef0);
          sVar13 = fread(local_30,(ulong)local_3c,1,local_20);
          if (sVar13 != 1) break;
          in_stack_ffffffffffffff54 = osrp2((uchar *)((long)&local_30->mcmcxgl + 4));
          in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 & 0xffff;
          if (in_stack_ffffffffffffff54 != 0) {
            osrp2((void *)((long)&local_30->mcmcxmsz + 2));
          }
          vociadd((voccxdef *)
                  CONCAT26(in_stack_fffffffffffffef6,
                           CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)),
                  in_stack_fffffffffffffeee,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                  (objnum *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
        }
        else {
          local_44 = osrp2(&cStack_65);
          local_3c = osrp2(&cStack_63);
          local_30 = (mcmcxdef *)
                     mcmlck((mcmcxdef *)
                            CONCAT26(in_stack_fffffffffffffece,in_stack_fffffffffffffec8),
                            in_stack_fffffffffffffec6);
          in_stack_fffffffffffffeec =
               *(objnum *)
                (*(long *)(*(long *)*local_50 +
                          (long)((int)(uint)*(ushort *)
                                             (local_50[(long)((int)(uint)local_22 >> 8) + 6] +
                                             (long)(int)(local_22 & 0xff) * 2) >> 8) * 8) +
                 (long)(int)(*(ushort *)
                              (local_50[(long)((int)(uint)local_22 >> 8) + 6] +
                              (long)(int)(local_22 & 0xff) * 2) & 0xff) * 0x20 + 0x18);
          in_stack_fffffffffffffeee = 0;
          uVar10 = osrp2(&local_30->mcmcxmsz);
          local_40 = CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec) -
                     (uVar10 & 0xffff);
          if (local_40 < local_3c) {
            local_30 = (mcmcxdef *)
                       objexp(in_stack_fffffffffffffed0,in_stack_fffffffffffffece,
                              (ushort *)
                              CONCAT26(in_stack_fffffffffffffec6,
                                       CONCAT24(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                                      ));
          }
          in_stack_fffffffffffffed0 = local_30;
          uVar10 = osrp2(&local_30->mcmcxmsz);
          local_38 = (void *)((long)in_stack_fffffffffffffed0->mcmcxmtb +
                             (long)(int)(uVar10 & 0xffff) + -0x30);
          oswp2((uchar *)((long)&local_30->mcmcxgl + 6),local_44);
          in_stack_fffffffffffffee0 = (voccxdef *)&local_30->mcmcxflg;
          in_stack_fffffffffffffedc = local_3c;
          uVar10 = osrp2(&local_30->mcmcxmsz);
          oswp2(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc + (uVar10 & 0xffff));
          sVar13 = fread(local_38,(ulong)local_3c,1,local_20);
          if (sVar13 != 1) {
            bVar7 = true;
          }
          objsetign(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1e);
        }
        lVar14 = *(long *)(*(long *)*local_50 +
                          (long)((int)(uint)*(ushort *)
                                             (local_50[(long)((int)(uint)local_22 >> 8) + 6] +
                                             (long)(int)(local_22 & 0xff) * 2) >> 8) * 8) +
                 (long)(int)(*(ushort *)
                              (local_50[(long)((int)(uint)local_22 >> 8) + 6] +
                              (long)(int)(local_22 & 0xff) * 2) & 0xff) * 0x20;
        *(ushort *)(lVar14 + 0x14) = *(ushort *)(lVar14 + 0x14) | 1;
        mcmunlck((mcmcxdef *)
                 CONCAT26(in_stack_fffffffffffffec6,
                          CONCAT24(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)),
                 (mcmon)((ulong)in_stack_fffffffffffffeb8 >> 0x30));
        if (bVar7) break;
      }
    }
    else {
      iVar8 = 4;
    }
  }
  else {
    iVar8 = 2;
  }
LAB_0027544e:
  fclose(local_20);
  return iVar8;
LAB_002751f0:
  sVar13 = fread(&local_68,8,1,local_20);
  if (sVar13 == 1) {
    uVar10 = (uint)local_68;
    uVar29 = (ushort)bStack_67;
    uVar30 = 0;
    iVar9 = osrp2(&cStack_66);
    iVar11 = osrp2(&cStack_64);
    iVar12 = osrp2(&cStack_62);
    local_22 = (ushort)iVar12;
    if (local_22 == 0xffff) {
      if (iVar31 != 1) {
        sVar13 = fread(&local_68,2,1,local_20);
        if (sVar13 != 1) goto LAB_0027544e;
        iVar8 = osrp2(&local_68);
        *(short *)(local_10 + 0xf40) = (short)iVar8;
      }
      fclose(local_20);
      return 0;
    }
    sVar13 = fread(&stack0xfffffffffffffefa,(long)iVar9,1,local_20);
    if (sVar13 != 1) goto LAB_0027544e;
    if (iVar11 == 0) {
      oswp2(&stack0xfffffffffffffef8,iVar9 + 2);
    }
    else {
      (&stack0xfffffffffffffef8)[iVar9 + 2] = 0x20;
      sVar13 = fread(&stack0xfffffffffffffef8 + (iVar9 + 3),(long)iVar11,1,local_20);
      if (sVar13 != 1) goto LAB_0027544e;
      oswp2(&stack0xfffffffffffffef8,iVar9 + iVar11 + 3);
    }
    if ((uVar29 & 8) == 0) {
      vocadd2((voccxdef *)CONCAT26(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00),
              in_stack_fffffffffffffefe,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
              (uchar *)CONCAT26(uVar30,CONCAT24(uVar29,uVar10)),
              CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec),
              in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
    }
    else {
      vocdel1(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6e,(char *)CONCAT44(iVar31,iVar8),
              (prpnum)((ulong)in_stack_ffffffffffffff58 >> 0x30),(int)in_stack_ffffffffffffff58,
              in_stack_ffffffffffffff54,in_stack_ffffffffffffff80);
    }
    goto LAB_002751f0;
  }
  goto LAB_0027544e;
}

Assistant:

int fiorso(voccxdef *vctx, char *fname)
{
    osfildef   *fp;
    objnum      obj;
    uchar      *p;
    uchar      *mut;
    uint        mutsiz;
    uint        oldmutsiz;
    int         propcnt;
    mcmcxdef   *mctx = vctx->voccxmem;
    uchar       buf[sizeof(FIOSAVHDR) + sizeof(FIOSAVVSN)];
    ushort      newsiz;
    int         err = FALSE;
    char        timestamp[26];
    int         version = 0;            /* version ID - 0 = current version */
    int         result;

    /* presume success */
    result = FIORSO_SUCCESS;

    /* open the input file */
    if (!(fp = osfoprb(fname, OSFTSAVE)))
        return FIORSO_FILE_NOT_FOUND;

    /* check for a prefix header - if it's there, skip it */
    if (!osfrb(fp, buf, (int)(sizeof(FIOSAVHDR_PREFIX) + 2))
        && memcmp(buf, FIOSAVHDR_PREFIX, sizeof(FIOSAVHDR_PREFIX)) == 0)
    {
        ulong skip_len;
        
        /*
         *   The prefix header is present - skip it.  The 2-byte value
         *   following the header is the length of the prefix data block
         *   (not including the header), so simply skip the additional
         *   number of bytes specified.  
         */
        skip_len = (ulong)osrp2(buf + sizeof(FIOSAVHDR_PREFIX));
        osfseek(fp, skip_len, OSFSK_CUR);
    }
    else
    {
        /* 
         *   there's no prefix header - seek back to the start of the file
         *   and read the standard header information
         */
        osfseek(fp, 0, OSFSK_SET);
    }

    
    /* read headers and check */
    if (osfrb(fp, buf, (int)(sizeof(FIOSAVHDR) + sizeof(FIOSAVVSN)))
        || memcmp(buf, FIOSAVHDR, (size_t)sizeof(FIOSAVHDR)))
    {
        /* it's not a saved game file */
        result = FIORSO_NOT_SAVE_FILE;
        goto ret_error;
    }

    /* check the version string */
    if (memcmp(buf + sizeof(FIOSAVHDR), FIOSAVVSN,
               (size_t)sizeof(FIOSAVVSN)) == 0)
    {
        /* it's the current version */
        version = 0;
    }
    else if (memcmp(buf + sizeof(FIOSAVHDR), FIOSAVVSN1,
                    (size_t)sizeof(FIOSAVVSN1)) == 0)
    {
        /* it's old version #1 */
        version = 1;
    }
    else
    {
        /* 
         *   this isn't a recognized version - the file must have been
         *   saved by a newer version of the system, so we can't assume we
         *   will be able to parse the format 
         */
        result = FIORSO_BAD_FMT_VSN;
        goto ret_error;
    }
    
    /* 
     *   Read timestamp and check - the game must have been saved by the
     *   same .GAM file that we are now running, because the .SAV file is
     *   written entirely in terms of the contents of the .GAM file; any
     *   change in the .GAM file invalidates the .SAV file. 
     */
    if (osfrb(fp, timestamp, 26)
        || memcmp(timestamp, vctx->voccxtim, (size_t)26))
    {
        result = FIORSO_BAD_GAME_VSN;
        goto ret_error;
    }
    
    /* first revert every object to original (post-compilation) state */
    vocrevert(vctx);

    /* 
     *   the most common error from here on is simply a file read error,
     *   so presume that this is what will happen; if we are successful or
     *   encounter a different error, we'll change the status at that
     *   point 
     */
    result = FIORSO_READ_ERROR;

    /* go through file and load changed objects */
    for (;;)
    {
        /* get the header */
        if (osfrb(fp, buf, 7))
            goto ret_error;

        /* get the object number from the header, and stop if we're done */
        obj = osrp2(buf+1);
        if (obj == MCMONINV)
            break;

        /* if the object was dynamically allocated, recreate it */
        if (buf[0] == 1)
        {
            int     sccnt;
            objnum  sc;
            
            /* create the object */
            mutsiz = osrp2(buf + 3);
            p = mcmalonum(mctx, (ushort)mutsiz, (mcmon)obj);

            /* read the object's contents */
            if (osfrb(fp, p, mutsiz))
                goto ret_error;

            /* get the superclass data (at most one superclass) */
            sccnt = objnsc(p);
            if (sccnt) sc = osrp2(objsc(p));

            /* create inheritance records for the object */
            vociadd(vctx, obj, MCMONINV, sccnt, &sc, VOCIFNEW | VOCIFVOC);

#if 0
            {
                int     wrdcnt;

                /* read the object's vocabulary and add it back */
                if (osfrb(fp, buf, 2))
                    goto ret_error;
                wrdcnt = osrp2(buf);
                while (wrdcnt--)
                {
                    int   len1;
                    int   len2;
                    char  wrd[80];
                    
                    /* read the header */
                    if (osfrb(fp, buf, 6))
                        goto ret_error;
                    len1 = osrp2(buf+2);
                    len2 = osrp2(buf+4);
                    
                    /* read the word text */
                    if (osfrb(fp, wrd, len1 + len2))
                        goto ret_error;
                    
                    /* add the word */
                    vocadd2(vctx, buf[0], obj, buf[1], wrd, len1,
                            wrd + len1, len2);
                }
            }
#endif

        }
        else
        {
            /* get the remaining data from the header */
            propcnt = osrp2(buf + 3);
            mutsiz = osrp2(buf + 5);
        
            /* expand object if it's not big enough for mutsiz */
            p = mcmlck(mctx, (mcmon)obj);
            oldmutsiz = mcmobjsiz(mctx, (mcmon)obj) - objrst(p);
            if (oldmutsiz < mutsiz)
            {
                newsiz = mutsiz - oldmutsiz;
                p = (uchar *)objexp(mctx, obj, &newsiz);
            }
            
            /* reset statistics, and read mutable part from file */
            mut = p + objrst(p);
            objsnp(p, propcnt);
            objsfree(p, mutsiz + objrst(p));
            if (osfrb(fp, mut, mutsiz))
                err = TRUE;
        
            /* reset ignore flags as needed */
            objsetign(mctx, obj);
        }

        /* touch and unlock the object */
        mcmtch(mctx, (mcmon)obj);
        mcmunlck(mctx, (mcmon)obj);
        if (err)
            goto ret_error;
    }
    
    /* read fuses/daemons/alarms */
    if (fiorfda(fp, vctx->voccxdmn, vctx->voccxdmc)
        || fiorfda(fp, vctx->voccxfus, vctx->voccxfuc)
        || fiorfda(fp, vctx->voccxalm, vctx->voccxalc))
        goto ret_error;

    /* read the dynamically added and deleted vocabulary */
    for (;;)
    {
        int     len1;
        int     len2;
        char    wrd[80];
        int     flags;
        int     typ;
        
        /* read the header */
        if (osfrb(fp, buf, 8))
            goto ret_error;

        typ = buf[0];
        flags = buf[1];
        len1 = osrp2(buf+2);
        len2 = osrp2(buf+4);
        obj = osrp2(buf+6);

        /* check to see if this is the end marker */
        if (obj == MCMONINV) break;
        
        /* read the word text */
        if (osfrb(fp, wrd+2, len1))
            goto ret_error;
        if (len2)
        {
            wrd[len1 + 2] = ' ';
            if (osfrb(fp, &wrd[len1 + 3], len2))
                goto ret_error;
            oswp2(wrd, len1 + len2 + 3);
        }
        else
            oswp2(wrd, len1 + 2);
        
        /* add or delete the word as appropriate */
        if (flags & VOCFDEL)
            vocdel1(vctx, obj, (char *)wrd, (prpnum)typ, FALSE, FALSE, FALSE);
        else
            vocadd2(vctx, buf[0], obj, buf[1], (uchar *)wrd+2, len1,
                    (uchar *)wrd+len1, len2);
    }

    /* 
     *   the following was added in save format version "v2.2.1", so skip
     *   it if the save version is older than that 
     */
    if (version != 1)
    {
        /* read the current "Me" object */
        if (osfrb(fp, buf, 2))
            goto ret_error;
        vctx->voccxme = osrp2(buf);
    }

    /* done - close file and return success indication */
    osfcls(fp);
    return FIORSO_SUCCESS;

    /* come here on failure - close file and return error indication */
ret_error:
    osfcls(fp);
    return result;
}